

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int dwarf_get_macro_op(Dwarf_Macro_Context macro_context,Dwarf_Unsigned op_number,
                      Dwarf_Unsigned *op_start_section_offset,Dwarf_Half *macro_operator,
                      Dwarf_Half *forms_count,Dwarf_Small **formcode_array,Dwarf_Error *error)

{
  byte bVar1;
  Dwarf_Debug dbg_00;
  Dwarf_Macro_Operator_s *pDVar2;
  Dwarf_Small *v;
  char *msg;
  char local_b8 [8];
  char buf [50];
  dwarfstring m;
  Dwarf_Half operator;
  Dwarf_Unsigned op_offset;
  Dwarf_Debug dbg;
  Dwarf_Macro_Operator_s *curop;
  Dwarf_Small **formcode_array_local;
  Dwarf_Half *forms_count_local;
  Dwarf_Half *macro_operator_local;
  Dwarf_Unsigned *op_start_section_offset_local;
  Dwarf_Unsigned op_number_local;
  Dwarf_Macro_Context macro_context_local;
  
  op_offset = 0;
  if ((macro_context == (Dwarf_Macro_Context)0x0) || (macro_context->mc_sentinel != 0xada)) {
    if (macro_context != (Dwarf_Macro_Context)0x0) {
      op_offset = (Dwarf_Unsigned)macro_context->mc_dbg;
    }
    _dwarf_error_string((Dwarf_Debug)op_offset,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
    macro_context_local._4_4_ = 1;
  }
  else {
    dbg_00 = macro_context->mc_dbg;
    if (op_number < macro_context->mc_macro_ops_count) {
      pDVar2 = macro_context->mc_ops + op_number;
      bVar1 = pDVar2->mo_opcode;
      if (bVar1 == 0) {
        *op_start_section_offset =
             (macro_context->mc_total_length + macro_context->mc_section_offset) - 1;
        *macro_operator = 0;
        *forms_count = 0;
        *formcode_array = (Dwarf_Small *)0x0;
        macro_context_local._4_4_ = 0;
      }
      else {
        v = pDVar2->mo_data +
            macro_context->mc_section_offset + (-1 - (long)macro_context->mc_macro_header);
        if (v < (Dwarf_Small *)macro_context->mc_section_size) {
          *op_start_section_offset = (Dwarf_Unsigned)v;
          *macro_operator = (ushort)bVar1;
          if (pDVar2->mo_form == (Dwarf_Macro_Forms_s *)0x0) {
            *forms_count = 0;
            *formcode_array = (Dwarf_Small *)0x0;
          }
          else {
            *forms_count = (ushort)pDVar2->mo_form->mf_formcount;
            *formcode_array = pDVar2->mo_form->mf_formbytes;
          }
          macro_context_local._4_4_ = 0;
        }
        else {
          dwarfstring_constructor_static((dwarfstring_s *)(buf + 0x30),local_b8,0x32);
          dwarfstring_append_printf_u
                    ((dwarfstring *)(buf + 0x30),"DW_DLE_MACRO_OFFSET_BAD: offset 0x%lx",
                     (dwarfstring_u)v);
          dwarfstring_append_printf_u
                    ((dwarfstring *)(buf + 0x30)," >= section size of 0x%lx",
                     macro_context->mc_section_size);
          msg = dwarfstring_string((dwarfstring_s *)(buf + 0x30));
          _dwarf_error_string(dbg_00,error,0x13e,msg);
          dwarfstring_destructor((dwarfstring_s *)(buf + 0x30));
          macro_context_local._4_4_ = 1;
        }
      }
    }
    else {
      _dwarf_error(dbg_00,error,0x143);
      macro_context_local._4_4_ = 1;
    }
  }
  return macro_context_local._4_4_;
}

Assistant:

int
dwarf_get_macro_op(Dwarf_Macro_Context macro_context,
    Dwarf_Unsigned op_number,
    Dwarf_Unsigned * op_start_section_offset,
    Dwarf_Half    * macro_operator,
    Dwarf_Half    * forms_count,
    const Dwarf_Small **   formcode_array,
    Dwarf_Error *error)
{
    struct Dwarf_Macro_Operator_s *curop = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Unsigned op_offset = 0;
    Dwarf_Half operator = 0;

    CHECKNULLCONTEXT(macro_context,dbg,error);
    dbg = macro_context->mc_dbg;
    if (op_number >= macro_context->mc_macro_ops_count) {
        _dwarf_error(dbg, error,DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    curop = macro_context->mc_ops + op_number;
    operator = curop->mo_opcode;
    if (!operator) {
        /*  For the null byte at the end
            of an operator list.  */
        *op_start_section_offset = macro_context->mc_total_length+
            macro_context->mc_section_offset -1;
        *macro_operator = operator;
        *forms_count  = 0;
        *formcode_array = 0;
        return DW_DLV_OK;
    }
    op_offset =
        ((curop->mo_data -1) - macro_context->mc_macro_header) +
        macro_context->mc_section_offset;
    if (op_offset >= macro_context->mc_section_size) {
        dwarfstring m;
        char buf[50];

        dwarfstring_constructor_static(&m,buf,sizeof(buf));
        dwarfstring_append_printf_u(&m,
            "DW_DLE_MACRO_OFFSET_BAD: offset 0x%lx",
            op_offset);
        dwarfstring_append_printf_u(&m,
            " >= section size of 0x%lx",
            macro_context->mc_section_size);
        _dwarf_error_string(dbg,error,DW_DLE_MACRO_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    *op_start_section_offset = op_offset;
    *macro_operator = operator;
    if (curop->mo_form) {
        *forms_count  = curop->mo_form->mf_formcount;
        *formcode_array = curop->mo_form->mf_formbytes;
    } else {
        /* ASSERT: macro_operator == 0 */
        *forms_count  = 0;
        *formcode_array = 0;
    }
    return DW_DLV_OK;
}